

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char,_unsigned_char>
* __thiscall
fmt::v8::
make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,unsigned_char_const&,unsigned_char&>
          (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char,_unsigned_char>
           *__return_storage_ptr__,v8 *this,uchar *args,uchar *args_1)

{
  uchar *args_local_1;
  uchar *args_local;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  uint *arg;
  longlong local_a8;
  size_t local_a0;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_const_1;
  bool formattable_char_1;
  uint *arg_1;
  longlong local_58;
  size_t local_50;
  
  local_a8._0_4_ = (uint)(byte)*this;
  local_58._0_4_ = (uint)*args;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = local_a8;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_a0;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = local_58;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_50;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {std::forward<Args>(args)...};
}